

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

BBox * __thiscall CMU462::DynamicScene::Sphere::get_bbox(Sphere *this)

{
  double dVar1;
  BBox *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = this->r;
  dVar2 = (this->p).x;
  dVar3 = dVar2 - dVar1;
  dVar2 = dVar2 + dVar1;
  (in_RDI->min).x = dVar3;
  (in_RDI->max).x = dVar2;
  dVar4 = (this->p).y;
  dVar5 = (this->p).z;
  dVar6 = dVar1 + dVar4;
  dVar7 = dVar1 + dVar5;
  dVar4 = dVar4 - dVar1;
  dVar5 = dVar5 - dVar1;
  (in_RDI->min).y = dVar4;
  (in_RDI->min).z = dVar5;
  (in_RDI->max).y = dVar6;
  (in_RDI->max).z = dVar7;
  (in_RDI->extent).x = dVar2 - dVar3;
  (in_RDI->extent).y = dVar6 - dVar4;
  (in_RDI->extent).z = dVar7 - dVar5;
  return in_RDI;
}

Assistant:

BBox Sphere::get_bbox() {
  return BBox(p.x - r, p.y - r, p.z - r, p.x + r, p.y + r, p.z + r);
}